

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  byte bVar1;
  uint uVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiTableSettings *pIVar5;
  long lVar6;
  int column_n;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  int iVar11;
  bool bVar12;
  uint uVar13;
  
  pIVar4 = GImGui;
  table->IsSettingsRequestLoad = false;
  if ((table->Flags & 0x10) == 0) {
    if (table->SettingsOffset == -1) {
      pIVar5 = TableSettingsFindByID(table->ID);
      if (pIVar5 == (ImGuiTableSettings *)0x0) {
        return;
      }
      if (table->ColumnsCount != (int)pIVar5->ColumnsCount) {
        table->IsSettingsDirty = true;
      }
      table->SettingsOffset = (int)pIVar5 - *(int *)&(pIVar4->SettingsTables).Buf.Data;
    }
    else {
      pIVar5 = TableGetBoundSettings(table);
    }
    table->SettingsLoadedFlags = pIVar5->SaveFlags;
    table->RefScale = pIVar5->RefScale;
    pbVar10 = (byte *)((long)&pIVar5[1].RefScale + 3);
    uVar8 = 0;
    for (iVar11 = 0; bVar1 = pIVar5->ColumnsCount, iVar11 < (char)bVar1; iVar11 = iVar11 + 1) {
      uVar13 = (uint)(char)pbVar10[-3];
      uVar9 = (ulong)uVar13;
      if ((-1 < (int)uVar13) && ((int)uVar13 < table->ColumnsCount)) {
        pIVar3 = (table->Columns).Data;
        uVar2 = pIVar5->SaveFlags;
        if ((uVar2 & 1) != 0) {
          *(undefined4 *)((long)&pIVar3[(int)uVar13].WidthRequest + (ulong)(*pbVar10 & 8)) =
               *(undefined4 *)(pbVar10 + -0xb);
          pIVar3[(int)uVar13].AutoFitQueue = '\0';
        }
        if ((uVar2 & 2) != 0) {
          uVar9 = (ulong)pbVar10[-2];
        }
        pIVar3[(int)uVar13].DisplayOrder = (ImGuiTableColumnIdx)uVar9;
        uVar8 = uVar8 | 1L << (uVar9 & 0x3f);
        bVar12 = (bool)(*pbVar10 >> 2 & 1);
        pIVar3[(int)uVar13].IsUserEnabledNextFrame = bVar12;
        pIVar3[(int)uVar13].IsUserEnabled = bVar12;
        pIVar3[(int)uVar13].SortOrder = pbVar10[-1];
        pIVar3[(int)uVar13].field_0x65 = pIVar3[(int)uVar13].field_0x65 & 0xfc | *pbVar10 & 3;
      }
      pbVar10 = pbVar10 + 0xc;
    }
    uVar9 = ~(-1L << (bVar1 & 0x3f));
    if (bVar1 == 0x40) {
      uVar9 = 0xffffffffffffffff;
    }
    if (uVar8 != uVar9) {
      lVar6 = 0x52;
      uVar9 = 0;
      uVar8 = (ulong)(uint)table->ColumnsCount;
      if (table->ColumnsCount < 1) {
        uVar8 = uVar9;
      }
      for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        *(char *)((long)&((table->Columns).Data)->Flags + lVar6) = (char)uVar9;
        lVar6 = lVar6 + 0x68;
      }
    }
    lVar6 = 0x52;
    for (lVar7 = 0; lVar7 < table->ColumnsCount; lVar7 = lVar7 + 1) {
      (table->DisplayOrderToIndex).Data[*(char *)((long)&((table->Columns).Data)->Flags + lVar6)] =
           (char)lVar7;
      lVar6 = lVar6 + 0x68;
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        if (settings->ColumnsCount != table->ColumnsCount) // Allow settings if columns count changed. We could otherwise decide to return...
            table->IsSettingsDirty = true;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }

    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    ImU64 display_order_mask = 0;
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->StretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImGuiTableColumnIdx)column_n;
        display_order_mask |= (ImU64)1 << column->DisplayOrder;
        column->IsUserEnabled = column->IsUserEnabledNextFrame = column_settings->IsEnabled;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // Validate and fix invalid display order data
    const ImU64 expected_display_order_mask = (settings->ColumnsCount == 64) ? ~0 : ((ImU64)1 << settings->ColumnsCount) - 1;
    if (display_order_mask != expected_display_order_mask)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            table->Columns[column_n].DisplayOrder = (ImGuiTableColumnIdx)column_n;

    // Rebuild index
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
}